

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessSetupOutputPipeFile(int *p,char *name)

{
  int iVar1;
  int iVar2;
  int fout;
  char *name_local;
  int *p_local;
  
  if (name == (char *)0x0) {
    p_local._4_4_ = 1;
  }
  else {
    kwsysProcessCleanupDescriptor(p);
    iVar1 = open64(name,0x241,0x1b6);
    if (iVar1 < 0) {
      p_local._4_4_ = 0;
    }
    else {
      iVar2 = fcntl64(iVar1,2,1);
      if (iVar2 < 0) {
        p_local._4_4_ = 0;
      }
      else {
        *p = iVar1;
        p_local._4_4_ = 1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static int kwsysProcessSetupOutputPipeFile(int* p, const char* name)
{
  int fout;
  if (!name) {
    return 1;
  }

  /* Close the existing descriptor.  */
  kwsysProcessCleanupDescriptor(p);

  /* Open a file for the pipe to write.  */
  if ((fout = open(name, O_WRONLY | O_CREAT | O_TRUNC, 0666)) < 0) {
    return 0;
  }

  /* Set close-on-exec flag on the pipe's end.  */
  if (fcntl(fout, F_SETFD, FD_CLOEXEC) < 0) {
    return 0;
  }

  /* Assign the replacement descriptor.  */
  *p = fout;
  return 1;
}